

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

void helics::CoreFactory::displayHelp(CoreType type)

{
  shared_ptr<helics::Core> core;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((type == UNRECOGNIZED) || (type == DEFAULT)) {
    std::operator<<((ostream *)&std::cout,"All core types have similar options\n");
    makeCore((CoreType)&core,(string_view)ZEXT816(0));
    (*(core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Core[2])
              (core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help");
    makeCore((CoreType)&local_18,(string_view)ZEXT816(0xb));
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,&local_18);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_18._M_refcount);
    (*(core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Core[2])
              (core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help");
  }
  else {
    makeCore((CoreType)&core,(string_view)ZEXT416(type));
    (*(core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Core[2])
              (core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help");
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &core.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto core = makeCore(CoreType::DEFAULT, gHelicsEmptyString);
        core->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        core = makeCore(CoreType::TCP_SS, gHelicsEmptyString);
        core->configure(helpStr);
#endif
    } else {
        auto core = makeCore(type, gHelicsEmptyString);
        core->configure(helpStr);
    }
}